

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<Fad<long_double>_>::VerifySymmetry(TPZMatrix<Fad<long_double>_> *this,REAL tol)

{
  double dVar1;
  ostream *poVar2;
  Fad<long_double> *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  longdouble lVar3;
  double in_XMM0_Qa;
  Fad<long_double> exp;
  int64_t j;
  int64_t i;
  int64_t ncols;
  int64_t nrows;
  Fad<long_double> *in_stack_fffffffffffffe80;
  Fad<long_double> *in_stack_fffffffffffffeb0;
  Fad<long_double> *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 uVar4;
  undefined6 in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffece;
  undefined1 local_118 [64];
  undefined1 local_d8 [48];
  undefined1 local_a8 [112];
  long local_38;
  long local_30;
  int64_t local_28;
  long local_20;
  double local_18;
  int local_4;
  
  local_18 = in_XMM0_Qa;
  local_20 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  local_28 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
  if (local_20 == local_28) {
    for (local_30 = 0; local_30 < local_20; local_30 = local_30 + 1) {
      for (local_38 = 0; local_38 <= local_30; local_38 = local_38 + 1) {
        (*((TPZSavable *)&in_RDI->val_)->_vptr_TPZSavable[0x21])(local_a8,in_RDI,local_30,local_38);
        (*((TPZSavable *)&in_RDI->val_)->_vptr_TPZSavable[0x21])(local_d8,in_RDI,local_38,local_30);
        operator-<Fad<long_double>,_Fad<long_double>,_nullptr>
                  (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        Fad<long_double>::Fad<FadBinaryMinus<Fad<long_double>,Fad<long_double>>>
                  (in_RDI,(FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_> *)
                          CONCAT26(in_stack_fffffffffffffece,in_stack_fffffffffffffec8));
        FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_> *)
                   in_stack_fffffffffffffe80);
        Fad<long_double>::~Fad(in_stack_fffffffffffffe80);
        Fad<long_double>::~Fad(in_stack_fffffffffffffe80);
        fabs<long_double>(in_stack_fffffffffffffe80);
        dVar1 = local_18;
        uVar4 = SUB104(in_ST0,0);
        in_stack_fffffffffffffec8 = (undefined6)((unkuint10)in_ST0 >> 0x20);
        lVar3 = in_ST7;
        if (local_18 < (double)in_ST0) {
          in_stack_fffffffffffffeb8 =
               (Fad<long_double> *)std::operator<<((ostream *)&std::cout,"Elemento: ");
          in_stack_fffffffffffffeb0 =
               (Fad<long_double> *)std::ostream::operator<<(in_stack_fffffffffffffeb8,local_30);
          poVar2 = std::operator<<((ostream *)in_stack_fffffffffffffeb0,", ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38);
          std::operator<<(poVar2,"  -> ");
          poVar2 = ::operator<<((ostream *)CONCAT44(uVar4,in_stack_fffffffffffffec0),
                                in_stack_fffffffffffffeb8);
          std::operator<<(poVar2,"/");
          (*((TPZSavable *)&in_RDI->val_)->_vptr_TPZSavable[0x21])
                    (local_118,in_RDI,local_30,local_38);
          in_stack_fffffffffffffe80 =
               (Fad<long_double> *)
               ::operator<<((ostream *)CONCAT44(uVar4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffeb8);
          std::ostream::operator<<(in_stack_fffffffffffffe80,std::endl<char,std::char_traits<char>>)
          ;
          Fad<long_double>::~Fad(in_stack_fffffffffffffe80);
          local_4 = 0;
        }
        Fad<long_double>::~Fad(in_stack_fffffffffffffe80);
        if (dVar1 < (double)in_ST0) {
          return local_4;
        }
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        in_ST7 = lVar3;
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::VerifySymmetry(REAL tol) const{
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if (nrows != ncols) return 0;
	
	for( int64_t i = 0; i < nrows; i++){
		for(int64_t j = 0; j <= i; j++){
            TVar exp = this->Get(i,j) - this->Get(j,i);
			if ( (REAL)(fabs( exp )) > tol ) {
			  	#ifdef STATE_COMPLEX
				cout << "Elemento: " << i << ", " << j << "  -> " << fabs( exp ) << "/" <<
				this->Get(i,j) << endl;
				#else
				cout << "Elemento: " << i << ", " << j << "  -> " << exp << "/" <<
				this->Get(i,j) << endl;
				#endif
				return 0;
			}
		}
	}
	return 1;
}